

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

string * __thiscall IR::Temp::type_abi_cxx11_(Temp *this)

{
  int iVar1;
  ulong uVar2;
  string *local_48;
  string *ty;
  allocator<char> local_11;
  Temp *local_10;
  Temp *this_local;
  
  local_10 = this;
  if ((type[abi:cxx11]()::kDefaultType_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&type[abi:cxx11]()::kDefaultType_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type[abi:cxx11]()::kDefaultType_abi_cxx11_,"unsigned",&local_11);
    std::allocator<char>::~allocator(&local_11);
    __cxa_atexit(std::__cxx11::string::~string,&type[abi:cxx11]()::kDefaultType_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&type[abi:cxx11]()::kDefaultType_abi_cxx11_);
  }
  local_48 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                       (&this->
                         super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       );
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    local_48 = &type[abi:cxx11]()::kDefaultType_abi_cxx11_;
  }
  return local_48;
}

Assistant:

const std::string& type() const {
    static std::string kDefaultType{"unsigned"};
    const std::string& ty = std::get<0>(*this);
    return !ty.empty() ? ty : kDefaultType;
  }